

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O0

char * stb_to_utf8(char *buffer,stb__wchar *str,int n)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int local_28;
  stb_uint32 c;
  int i;
  int n_local;
  stb__wchar *str_local;
  char *buffer_local;
  
  local_28 = 0;
  iVar1 = n + -1;
  _i = str;
  while( true ) {
    while( true ) {
      while( true ) {
        while( true ) {
          if (*_i == 0) {
            buffer[local_28] = '\0';
            return buffer;
          }
          if (0x7f < *_i) break;
          if (iVar1 < local_28 + 1) {
            return (char *)0x0;
          }
          buffer[local_28] = (char)*_i;
          local_28 = local_28 + 1;
          _i = _i + 1;
        }
        if (0x7ff < *_i) break;
        if (iVar1 < local_28 + 2) {
          return (char *)0x0;
        }
        iVar3 = local_28 + 1;
        buffer[local_28] = (char)((int)(uint)*_i >> 6) + -0x40;
        local_28 = local_28 + 2;
        buffer[iVar3] = ((byte)*_i & 0x3f) + 0x80;
        _i = _i + 1;
      }
      if ((*_i < 0xd800) || (0xdbff < *_i)) break;
      if (iVar1 < local_28 + 4) {
        return (char *)0x0;
      }
      uVar2 = (*_i - 0xd800) * 0x400 + (uint)_i[1] + 0x2400;
      buffer[local_28] = (char)(uVar2 >> 0x12) + -0x10;
      buffer[local_28 + 1] = ((byte)(uVar2 >> 0xc) & 0x3f) + 0x80;
      iVar3 = local_28 + 3;
      buffer[local_28 + 2] = ((byte)(uVar2 >> 6) & 0x3f) + 0x80;
      local_28 = local_28 + 4;
      buffer[iVar3] = ((byte)uVar2 & 0x3f) + 0x80;
      _i = _i + 2;
    }
    if ((0xdbff < *_i) && (*_i < 0xe000)) break;
    if (iVar1 < local_28 + 3) {
      return (char *)0x0;
    }
    buffer[local_28] = (char)((int)(uint)*_i >> 0xc) + -0x20;
    iVar3 = local_28 + 2;
    buffer[local_28 + 1] = ((byte)((int)(uint)*_i >> 6) & 0x3f) + 0x80;
    local_28 = local_28 + 3;
    buffer[iVar3] = ((byte)*_i & 0x3f) + 0x80;
    _i = _i + 1;
  }
  return (char *)0x0;
}

Assistant:

char * stb_to_utf8(char *buffer, stb__wchar *str, int n)
{
   int i=0;
   --n;
   while (*str) {
      if (*str < 0x80) {
         if (i+1 > n) return NULL;
         buffer[i++] = (char) *str++;
      } else if (*str < 0x800) {
         if (i+2 > n) return NULL;
         buffer[i++] = 0xc0 + (*str >> 6);
         buffer[i++] = 0x80 + (*str & 0x3f);
         str += 1;
      } else if (*str >= 0xd800 && *str < 0xdc00) {
         stb_uint32 c;
         if (i+4 > n) return NULL;
         c = ((str[0] - 0xd800) << 10) + ((str[1]) - 0xdc00) + 0x10000;
         buffer[i++] = 0xf0 + (c >> 18);
         buffer[i++] = 0x80 + ((c >> 12) & 0x3f);
         buffer[i++] = 0x80 + ((c >>  6) & 0x3f);
         buffer[i++] = 0x80 + ((c      ) & 0x3f);
         str += 2;
      } else if (*str >= 0xdc00 && *str < 0xe000) {
         return NULL;
      } else {
         if (i+3 > n) return NULL;
         buffer[i++] = 0xe0 + (*str >> 12);
         buffer[i++] = 0x80 + ((*str >> 6) & 0x3f);
         buffer[i++] = 0x80 + ((*str     ) & 0x3f);
         str += 1;
      }
   }
   buffer[i] = 0;
   return buffer;
}